

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_connect(connectdata *conn,_Bool *done)

{
  char *value;
  uint *sasl;
  char cVar1;
  uint uVar2;
  char *first;
  int iVar3;
  CURLcode CVar4;
  CURLcode CVar5;
  size_t len;
  char *pcVar6;
  
  *done = false;
  CVar5 = CURLE_OK;
  Curl_conncontrol(conn,0);
  (conn->proto).ftpc.pp.response_time = 1800000;
  (conn->proto).ftpc.pp.statemach_act = pop3_statemach_act;
  (conn->proto).ftpc.pp.endofresp = pop3_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  (conn->proto).ftpc.count3 = -1;
  sasl = &(conn->proto).imapc.sasl.prefmech;
  Curl_sasl_init((SASL *)sasl,&saslpop3);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  first = conn->options;
  (conn->proto).ftpc.transfertype = '\x01';
  if (first != (char *)0x0) {
    cVar1 = *first;
    CVar5 = CURLE_OK;
    while (pcVar6 = first, cVar1 != '\0') {
      for (; (*pcVar6 != '\0' && (*pcVar6 != '=')); pcVar6 = pcVar6 + 1) {
      }
      value = pcVar6 + 1;
      len = 0xffffffffffffffff;
      for (; (*pcVar6 != '\0' && (*pcVar6 != ';')); pcVar6 = pcVar6 + 1) {
        len = len + 1;
      }
      iVar3 = Curl_strncasecompare(first,"AUTH=",5);
      if (iVar3 == 0) {
        CVar5 = CURLE_URL_MALFORMAT;
      }
      else {
        CVar4 = Curl_sasl_parse_url_auth_option((SASL *)sasl,value,len);
        CVar5 = CURLE_OK;
        if ((CVar4 != CURLE_OK) &&
           (iVar3 = Curl_strncasecompare(value,"+APOP",len), CVar5 = CVar4, iVar3 != 0)) {
          (conn->proto).ftpc.count3 = 2;
          (conn->proto).imapc.preftype = 0;
          CVar5 = CURLE_OK;
        }
      }
      if (CVar5 != CURLE_OK) break;
      first = pcVar6 + (*pcVar6 == ';');
      cVar1 = pcVar6[*pcVar6 == ';'];
    }
  }
  if ((conn->proto).ftpc.count3 != 2) {
    uVar2 = (conn->proto).imapc.preftype;
    iVar3 = (uint)(uVar2 != 0xffffffdf) * 5 + -1;
    if (uVar2 == 0) {
      iVar3 = 0;
    }
    (conn->proto).ftpc.count3 = iVar3;
  }
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  (conn->proto).imapc.state = IMAP_SERVERGREET;
  CVar5 = pop3_multi_statemach(conn,done);
  return CVar5;
}

Assistant:

static CURLcode pop3_connect(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in POP3 */
  connkeep(conn, "POP3 default");

  /* Set the default response time-out */
  pp->response_time = RESP_TIMEOUT;
  pp->statemach_act = pop3_statemach_act;
  pp->endofresp = pop3_endofresp;
  pp->conn = conn;

  /* Set the default preferred authentication type and mechanism */
  pop3c->preftype = POP3_TYPE_ANY;
  Curl_sasl_init(&pop3c->sasl, &saslpop3);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = pop3_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  state(conn, POP3_SERVERGREET);

  result = pop3_multi_statemach(conn, done);

  return result;
}